

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_hash_set_test.cc
# Opt level: O1

void __thiscall
phmap::priv::anon_unknown_5::ParallelFlatHashSet_ModifyIf_Test::TestBody
          (ParallelFlatHashSet_ModifyIf_Test *this)

{
  bool bVar1;
  slot_type *psVar2;
  anon_class_1_0_00000001 *f;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  f_00;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_01;
  char *message;
  key_equal *expected_predicate_value;
  pointer *__ptr;
  AssertionResult AVar3;
  initializer_list<phmap::priv::(anonymous_namespace)::Entry> iVar4;
  AssertionResult gtest_ar_;
  size_t offset;
  int val;
  Set m;
  allocator_type *in_stack_fffffffffffffc98;
  key_arg<phmap::priv::(anonymous_namespace)::Entry> local_360;
  AssertHelper local_358;
  Message local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_348;
  undefined1 local_340 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_338;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330;
  int local_31c;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
  local_318;
  
  local_340._0_4_ = 1;
  local_340._4_4_ = 7;
  pbStack_338 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x900000002;
  expected_predicate_value = (key_equal *)&local_358;
  iVar4._M_len = 2;
  iVar4._M_array = (iterator)local_340;
  parallel_flat_hash_set<phmap::priv::(anonymous_namespace)::Entry,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>,_4UL,_phmap::NullMutex>
  ::parallel_hash_set((parallel_flat_hash_set<phmap::priv::(anonymous_namespace)::Entry,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>,_4UL,_phmap::NullMutex>
                       *)&local_318,iVar4,(size_t)&local_350,(hasher *)&local_360,
                      expected_predicate_value,in_stack_fffffffffffffc98);
  local_340._0_4_ = 2;
  local_340._4_4_ = 0;
  bVar1 = parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,std::allocator<phmap::priv::(anonymous_namespace)::Entry>>
          ::
          modify_if<phmap::priv::(anonymous_namespace)::Entry,phmap::priv::(anonymous_namespace)::ParallelFlatHashSet_ModifyIf_Test::TestBody()::__0&>
                    ((parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,std::allocator<phmap::priv::(anonymous_namespace)::Entry>>
                      *)&local_318,(key_arg<phmap::priv::(anonymous_namespace)::Entry> *)local_340,f
                    );
  local_350.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ =
       CONCAT31(local_350.ss_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._1_3_,bVar1);
  local_348 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&local_360);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_340,(internal *)&local_350,
               (AssertionResult *)"m.modify_if(Entry{2}, set_value)","false","true",
               (char *)expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/parallel_hash_set_test.cc"
               ,0x39,(char *)local_340);
    testing::internal::AssertHelper::operator=(&local_358,(Message *)&local_360);
    testing::internal::AssertHelper::~AssertHelper(&local_358);
    if (local_340 != (undefined1  [8])&local_330) {
      operator_delete((void *)local_340,local_330._M_allocated_capacity + 1);
    }
    if (local_360 != (key_arg<phmap::priv::(anonymous_namespace)::Entry>)0x0) {
      (**(code **)(*(long *)local_360 + 8))();
    }
  }
  if (local_348 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_348,local_348);
  }
  local_31c = 0;
  local_360.key = 2;
  local_360.value = 0;
  bVar1 = raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
          ::find_impl<phmap::priv::(anonymous_namespace)::Entry>
                    (&local_318.sets_._M_elems[5].set_,&local_360,0x712ee8ab0cd78e1e,
                     (size_t *)local_340);
  psVar2 = (slot_type *)0x0;
  if (bVar1) {
    psVar2 = local_318.sets_._M_elems[5].set_.slots_ + (long)local_340;
  }
  if (psVar2 != (slot_type *)0x0) {
    local_31c = psVar2->value;
  }
  local_350.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ =
       CONCAT31(local_350.ss_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._1_3_,psVar2 != (slot_type *)0x0);
  local_348 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (psVar2 == (slot_type *)0x0) {
    testing::Message::Message((Message *)&local_360);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_340,(internal *)&local_350,(AssertionResult *)0x210858,"false","true"
               ,(char *)expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/parallel_hash_set_test.cc"
               ,0x3d,(char *)local_340);
    testing::internal::AssertHelper::operator=(&local_358,(Message *)&local_360);
    testing::internal::AssertHelper::~AssertHelper(&local_358);
    if (local_340 != (undefined1  [8])&local_330) {
      operator_delete((void *)local_340,local_330._M_allocated_capacity + 1);
    }
    if (local_360 != (key_arg<phmap::priv::(anonymous_namespace)::Entry>)0x0) {
      (**(code **)(*(long *)local_360 + 8))();
    }
  }
  if (local_348 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_348,local_348);
  }
  local_350.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0xb;
  AVar3 = testing::internal::CmpHelperEQ<int,int>
                    ((internal *)local_340,"val","11",&local_31c,(int *)&local_350);
  f_00._M_head_impl =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       AVar3.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  if (local_340[0] == (internal)0x0) {
    testing::Message::Message(&local_350);
    if (pbStack_338 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (pbStack_338->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_360,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/parallel_hash_set_test.cc"
               ,0x3e,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_360,&local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_360);
    f_00 = extraout_RDX.
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
    if ((long *)CONCAT44(local_350.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_350.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_350.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_350.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
      f_00._M_head_impl = extraout_RDX_00;
    }
  }
  if (pbStack_338 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_338,pbStack_338);
    f_00._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         extraout_RDX_01.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
  }
  local_340._0_4_ = 3;
  local_340._4_4_ = 0;
  bVar1 = parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,std::allocator<phmap::priv::(anonymous_namespace)::Entry>>
          ::
          modify_if<phmap::priv::(anonymous_namespace)::Entry,phmap::priv::(anonymous_namespace)::ParallelFlatHashSet_ModifyIf_Test::TestBody()::__0&>
                    ((parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,std::allocator<phmap::priv::(anonymous_namespace)::Entry>>
                      *)&local_318,(key_arg<phmap::priv::(anonymous_namespace)::Entry> *)local_340,
                     (anon_class_1_0_00000001 *)f_00._M_head_impl);
  local_350.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ =
       CONCAT31(local_350.ss_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._1_3_,!bVar1);
  local_348 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_360);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_340,(internal *)&local_350,
               (AssertionResult *)"m.modify_if(Entry{3}, set_value)","true","false",
               (char *)expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/parallel_hash_set_test.cc"
               ,0x40,(char *)local_340);
    testing::internal::AssertHelper::operator=(&local_358,(Message *)&local_360);
    testing::internal::AssertHelper::~AssertHelper(&local_358);
    if (local_340 != (undefined1  [8])&local_330) {
      operator_delete((void *)local_340,local_330._M_allocated_capacity + 1);
    }
    if (local_360 != (key_arg<phmap::priv::(anonymous_namespace)::Entry>)0x0) {
      (**(code **)(*(long *)local_360 + 8))();
    }
  }
  if (local_348 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_348,local_348);
  }
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
  ::~parallel_hash_set(&local_318);
  return;
}

Assistant:

Entry(int k, int v=0) : key(k), value(v) {}